

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evaluator.c
# Opt level: O0

Value * evaluate_infix_expression(Scope *scope,InfixExpression *infix_expression)

{
  Operator operator_00;
  char *name;
  Variable *pVVar1;
  Value *pVVar2;
  Value *pVVar3;
  Variable *variable_1;
  char *identifier_1;
  Variable *variable;
  char *identifier;
  Scope *pSStack_38;
  Operator operator;
  Value *result_value;
  Value *right_value;
  Value *left_value;
  InfixExpression *infix_expression_local;
  Scope *scope_local;
  
  right_value = (Value *)0x0;
  operator_00 = infix_expression->operator;
  if (((((operator_00 == ASSIGN_OP) || (operator_00 == ASSIGN_ADDITION_OP)) ||
       (operator_00 == ASSIGN_SUBTRACTION_OP)) ||
      ((operator_00 == ASSIGN_MULTIPLICATION_OP || (operator_00 == ASSIGN_DIVISION_OP)))) ||
     ((operator_00 == ASSIGN_INTEGER_DIVISION_OP ||
      ((operator_00 == ASSIGN_EXPONENT_OP || (operator_00 == ASSIGN_MOD_OP)))))) {
    if (infix_expression->left_expression->expression_type == ExpressionTypeIdentifierExpression) {
      name = *(char **)(infix_expression->left_expression->literal + 2);
      pVVar1 = scope_get_variable(scope,ValueTypeNullValue,name);
      right_value = new_null_value();
      if (pVVar1 != (Variable *)0x0) {
        right_value = pVVar1->value;
      }
      pVVar2 = evaluate_expression(scope,infix_expression->right_expression);
      pVVar3 = apply_assign_operation(right_value,pVVar2,operator_00);
      scope_set_variable(scope,ValueTypeNullValue,name,pVVar3,0);
      free_value(pVVar2);
      scope_local = (Scope *)new_null_value();
    }
    else if (infix_expression->left_expression->expression_type == ExpressionTypeIndexExpression) {
      if (infix_expression->operator != ASSIGN_OP) {
        right_value = evaluate_expression(scope,infix_expression->left_expression);
      }
      pVVar2 = evaluate_expression(scope,infix_expression->right_expression);
      pVVar3 = apply_assign_operation(right_value,pVVar2,infix_expression->operator);
      pVVar3 = apply_index_operation
                         (scope,(IndexExpression *)infix_expression->left_expression,pVVar3);
      free_value(pVVar3);
      if (right_value != (Value *)0x0) {
        free_value(right_value);
      }
      free_value(pVVar2);
      scope_local = (Scope *)new_null_value();
    }
    else {
      scope_local = (Scope *)new_null_value();
    }
  }
  else if (operator_00 == MEMBER_OP) {
    pVVar2 = evaluate_expression(scope,infix_expression->left_expression);
    pVVar1 = scope_get_variable(scope,pVVar2->value_type,
                                *(char **)(infix_expression->right_expression->literal + 2));
    free_value(pVVar2);
    if (pVVar1 == (Variable *)0x0) {
      scope_local = (Scope *)new_null_value();
    }
    else {
      pVVar1->value->context_value = pVVar2;
      scope_local = (Scope *)pVVar1->value;
    }
  }
  else {
    pVVar2 = evaluate_expression(scope,infix_expression->left_expression);
    pVVar3 = evaluate_expression(scope,infix_expression->right_expression);
    switch(infix_expression->operator) {
    case ADDITION_OP:
      pSStack_38 = (Scope *)apply_addition_operation(pVVar2,pVVar3);
      break;
    default:
      pSStack_38 = (Scope *)new_null_value();
      break;
    case SUBTRACTION_OP:
      pSStack_38 = (Scope *)apply_subtraction_operation(pVVar2,pVVar3);
      break;
    case MULTIPLICATION_OP:
      pSStack_38 = (Scope *)apply_multiplication_operation(pVVar2,pVVar3);
      break;
    case DIVISION_OP:
      pSStack_38 = (Scope *)apply_division_operation(pVVar2,pVVar3,false);
      break;
    case INTEGER_DIVISION_OP:
      pSStack_38 = (Scope *)apply_division_operation(pVVar2,pVVar3,true);
      break;
    case EXPONENT_OP:
      pSStack_38 = (Scope *)apply_exponent_operation(pVVar2,pVVar3);
      break;
    case MOD_OP:
      pSStack_38 = (Scope *)apply_mod_operation(pVVar2,pVVar3);
      break;
    case CHECK_EQUALITY_OP:
      pSStack_38 = (Scope *)apply_check_equality_operation(pVVar2,pVVar3);
      break;
    case CHECK_NOT_EQUALITY_OP:
      pSStack_38 = (Scope *)apply_check_not_equality_operation(pVVar2,pVVar3);
      break;
    case CHECK_BIGGER_OP:
      pSStack_38 = (Scope *)apply_check_bigger_operation(pVVar2,pVVar3);
      break;
    case CHECK_BIGGER_EQUAL_OP:
      pSStack_38 = (Scope *)apply_check_bigger_equal_operation(pVVar2,pVVar3);
      break;
    case CHECK_SMALLER_OP:
      pSStack_38 = (Scope *)apply_check_smaller_operation(pVVar2,pVVar3);
      break;
    case CHECK_SMALLER_EQUAL_OP:
      pSStack_38 = (Scope *)apply_check_smaller_equal_operation(pVVar2,pVVar3);
      break;
    case RANGE_OP:
      pSStack_38 = (Scope *)apply_range_operation(pVVar2,pVVar3);
    }
    free_value(pVVar2);
    free_value(pVVar3);
    scope_local = pSStack_38;
  }
  return (Value *)scope_local;
}

Assistant:

Value *evaluate_infix_expression(Scope *scope, InfixExpression *infix_expression) {
  Value *left_value = NULL, *right_value = NULL, *result_value;

  Operator operator = infix_expression->operator;

  if (operator == ASSIGN_OP ||
    operator == ASSIGN_ADDITION_OP ||
    operator == ASSIGN_SUBTRACTION_OP ||
    operator == ASSIGN_MULTIPLICATION_OP ||
    operator == ASSIGN_DIVISION_OP ||
    operator == ASSIGN_INTEGER_DIVISION_OP ||
    operator == ASSIGN_EXPONENT_OP ||
    operator == ASSIGN_MOD_OP) {

    if (infix_expression->left_expression->expression_type == ExpressionTypeIdentifierExpression) {
      char *identifier = ((StringLiteral *) infix_expression->left_expression->literal)->string_literal;

      Variable *variable = scope_get_variable(scope, ValueTypeNullValue, identifier);

      left_value = new_null_value();

      if (variable != NULL) {
        left_value = variable->value;
      }

      right_value = evaluate_expression(scope, infix_expression->right_expression);
      result_value = apply_assign_operation(left_value, right_value, operator);

      scope_set_variable(scope, ValueTypeNullValue, identifier, result_value, false);

      free_value(right_value);

      return new_null_value();
    }
    else if (infix_expression->left_expression->expression_type == ExpressionTypeIndexExpression) {
      if (infix_expression->operator != ASSIGN_OP) {
        left_value = evaluate_expression(scope, infix_expression->left_expression);
      }

      right_value = evaluate_expression(scope, infix_expression->right_expression);
      result_value = apply_assign_operation(left_value, right_value, infix_expression->operator);

      free_value(apply_index_operation(scope, (IndexExpression *) infix_expression->left_expression, result_value));

      if (left_value != NULL) free_value(left_value);
      free_value(right_value);

      return new_null_value();
    }

    return new_null_value();
  }
  else if (operator == MEMBER_OP) {
    left_value = evaluate_expression(scope, infix_expression->left_expression);

    char *identifier = ((StringLiteral *) infix_expression->right_expression->literal)->string_literal;

    Variable *variable = scope_get_variable(scope, left_value->value_type, identifier);

    free_value(left_value);

    if (variable == NULL) return new_null_value();

    variable->value->context_value = left_value;

    return variable->value;
  }

  left_value = evaluate_expression(scope, infix_expression->left_expression);
  right_value = evaluate_expression(scope, infix_expression->right_expression);

  switch (infix_expression->operator) {
    case ADDITION_OP: {
      result_value = apply_addition_operation(left_value, right_value);
      break;
    }

    case SUBTRACTION_OP: {
      result_value = apply_subtraction_operation(left_value, right_value);
      break;
    }

    case MULTIPLICATION_OP: {
      result_value = apply_multiplication_operation(left_value, right_value);
      break;
    }

    case DIVISION_OP: {
      result_value = apply_division_operation(left_value, right_value, false);
      break;
    }

    case INTEGER_DIVISION_OP: {
      result_value = apply_division_operation(left_value, right_value, true);
      break;
    }

    case EXPONENT_OP: {
      result_value = apply_exponent_operation(left_value, right_value);
      break;
    }

    case MOD_OP: {
      result_value = apply_mod_operation(left_value, right_value);
      break;
    }

    case RANGE_OP: {
      result_value = apply_range_operation(left_value, right_value);
      break;
    }

    case CHECK_EQUALITY_OP: {
      result_value = apply_check_equality_operation(left_value, right_value);
      break;
    }

    case CHECK_NOT_EQUALITY_OP: {
      result_value = apply_check_not_equality_operation(left_value, right_value);
      break;
    }

    case CHECK_BIGGER_OP: {
      result_value = apply_check_bigger_operation(left_value, right_value);
      break;
    }

    case CHECK_BIGGER_EQUAL_OP: {
      result_value = apply_check_bigger_equal_operation(left_value, right_value);
      break;
    }

    case CHECK_SMALLER_OP: {
      result_value = apply_check_smaller_operation(left_value, right_value);
      break;
    }

    case CHECK_SMALLER_EQUAL_OP: {
      result_value = apply_check_smaller_equal_operation(left_value, right_value);
      break;
    }

    default: {
      result_value = new_null_value();
    }
  }

  free_value(left_value);
  free_value(right_value);

  return result_value;
}